

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  string *this;
  undefined8 uVar9;
  long *local_d0 [2];
  long local_c0 [2];
  size_type *local_b0;
  string negative;
  string positive;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_type *local_50;
  string str;
  
  psVar1 = &str._M_string_length;
  pcVar2 = (test_suite_name->_M_dataplus)._M_p;
  local_50 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + test_suite_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  positive.field_2._8_8_ = &local_60;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_60._M_allocated_capacity = *psVar7;
    local_60._8_8_ = plVar4[3];
  }
  else {
    local_60._M_allocated_capacity = *psVar7;
    positive.field_2._8_8_ = (size_type *)*plVar4;
  }
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_50 != psVar1) {
    operator_delete(local_50,str._M_string_length + 1);
  }
  local_50 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,FLAGS_gtest_filter_abi_cxx11_,
             DAT_002b0cd0 + FLAGS_gtest_filter_abi_cxx11_);
  psVar1 = local_50;
  pcVar5 = strchr((char *)local_50,0x2d);
  negative.field_2._8_8_ = &positive._M_string_length;
  positive._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  local_b0 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  negative._M_string_length._0_1_ = 0;
  if (pcVar5 == (char *)0x0) {
    strlen((char *)psVar1);
    std::__cxx11::string::_M_replace
              ((ulong)((long)&negative.field_2 + 8),0,(char *)0x0,(ulong)psVar1);
    pcVar5 = "";
    this = (string *)&local_b0;
    _Var8 = negative._M_dataplus;
  }
  else {
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,psVar1,pcVar5);
    this = (string *)(negative.field_2._M_local_buf + 8);
    std::__cxx11::string::operator=(this,(string *)local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    local_d0[0] = local_c0;
    sVar6 = strlen(pcVar5 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,pcVar5 + 1,pcVar5 + sVar6 + 1);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_0013952a;
    pcVar5 = "*";
    _Var8._M_p = (char *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,_Var8._M_p,(ulong)pcVar5);
LAB_0013952a:
  uVar9 = negative.field_2._8_8_;
  bVar3 = MatchesFilter((string *)((long)&positive.field_2 + 8),(char *)negative.field_2._8_8_);
  psVar1 = local_b0;
  if (bVar3) {
    bVar3 = MatchesFilter((string *)((long)&positive.field_2 + 8),(char *)local_b0);
    bVar3 = !bVar3;
  }
  else {
    bVar3 = false;
  }
  if (psVar1 != &negative._M_string_length) {
    operator_delete(psVar1,CONCAT71(negative._M_string_length._1_7_,
                                    (undefined1)negative._M_string_length) + 1);
    uVar9 = negative.field_2._8_8_;
  }
  if ((size_type *)uVar9 != &positive._M_string_length) {
    operator_delete((void *)uVar9,
                    CONCAT71(positive._M_string_length._1_7_,(undefined1)positive._M_string_length)
                    + 1);
  }
  if (local_50 != &str._M_string_length) {
    operator_delete(local_50,str._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)positive.field_2._8_8_ != &local_60) {
    operator_delete((void *)positive.field_2._8_8_,local_60._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  const std::string& full_name = test_suite_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  std::string str = GTEST_FLAG_GET(filter);
  const char* const p = str.c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == nullptr) {
    positive = str.c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}